

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O3

void __thiscall capnp::EzRpcClient::Impl::Impl(Impl *this,int socketFd,ReaderOptions readerOpts)

{
  LowLevelAsyncIoProvider *pLVar1;
  AsyncIoStream *pAVar2;
  Own<capnp::EzRpcClient::Impl::ClientContext> OVar3;
  Own<kj::AsyncIoStream> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  ReaderOptions local_28;
  
  local_28.traversalLimitInWords = readerOpts.traversalLimitInWords;
  local_28.nestingLimit = readerOpts.nestingLimit;
  EzRpcContext::getThreadLocal();
  kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
  local_48.disposer = (Disposer *)CONCAT44(uStack_34,local_38);
  local_48.ptr = uStack_30;
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  pAVar2 = local_48.ptr;
  if (local_48.ptr != (AsyncIoStream *)0x0) {
    local_48.ptr = (AsyncIoStream *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               (pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream);
  }
  pLVar1 = (((this->context).ptr)->ioContext).lowLevelProvider.ptr;
  (*pLVar1->_vptr_LowLevelAsyncIoProvider[2])(&local_48,pLVar1,socketFd,0);
  OVar3 = kj::
          heap<capnp::EzRpcClient::Impl::ClientContext,kj::Own<kj::AsyncIoStream>,capnp::ReaderOptions&>
                    ((kj *)&local_38,&local_48,&local_28);
  pAVar2 = local_48.ptr;
  *(undefined4 *)&(this->clientContext).ptr.disposer = local_38;
  *(undefined4 *)((long)&(this->clientContext).ptr.disposer + 4) = uStack_34;
  *(undefined4 *)&(this->clientContext).ptr.ptr = (undefined4)uStack_30;
  *(undefined4 *)((long)&(this->clientContext).ptr.ptr + 4) = uStack_30._4_4_;
  uStack_30 = (AsyncIoStream *)0x0;
  if (local_48.ptr != (AsyncIoStream *)0x0) {
    local_48.ptr = (AsyncIoStream *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               (pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
               (long)&(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream,OVar3.ptr);
  }
  return;
}

Assistant:

Impl(int socketFd, ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(kj::Promise<void>(kj::READY_NOW).fork()),
        clientContext(kj::heap<ClientContext>(
            context->getLowLevelIoProvider().wrapSocketFd(socketFd),
            readerOpts)) {}